

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O0

pair<helics::SmallBuffer,_TimeRepresentation<count_time<9,_long>_>_> * __thiscall
helics::FederateState::getPublishedValue(FederateState *this,InterfaceHandle handle)

{
  PublicationInfo *pPVar1;
  FederateState *in_RSI;
  pair<helics::SmallBuffer,_TimeRepresentation<count_time<9,_long>_>_> *in_RDI;
  PublicationInfo *pub;
  pair<helics::SmallBuffer,_TimeRepresentation<count_time<9,_long>_>_> *__x;
  pair<helics::SmallBuffer,_TimeRepresentation<count_time<9,_long>_>_> *in_stack_ffffffffffffff60;
  InterfaceInfo *in_stack_ffffffffffffff78;
  InterfaceHandle in_stack_ffffffffffffff84;
  
  __x = in_RDI;
  interfaces(in_RSI);
  pPVar1 = InterfaceInfo::getPublication(in_stack_ffffffffffffff78,in_stack_ffffffffffffff84);
  if (pPVar1 == (PublicationInfo *)0x0) {
    SmallBuffer::SmallBuffer(&in_RDI->first);
    TimeRepresentation<count_time<9,_long>_>::minVal();
    std::pair<helics::SmallBuffer,_TimeRepresentation<count_time<9,_long>_>_>::
    pair<helics::SmallBuffer,_TimeRepresentation<count_time<9,_long>_>,_true>
              (in_stack_ffffffffffffff60,&__x->first,
               (TimeRepresentation<count_time<9,_long>_> *)in_RDI);
    SmallBuffer::~SmallBuffer(&in_RDI->first);
  }
  else {
    std::pair<helics::SmallBuffer,_TimeRepresentation<count_time<9,_long>_>_>::
    pair<helics::SmallBuffer_&,_TimeRepresentation<count_time<9,_long>_>_&,_true>
              (in_stack_ffffffffffffff60,&__x->first,
               (TimeRepresentation<count_time<9,_long>_> *)in_RDI);
  }
  return __x;
}

Assistant:

std::pair<SmallBuffer, Time> FederateState::getPublishedValue(InterfaceHandle handle)
{
    auto* pub = interfaces().getPublication(handle);
    if (pub != nullptr) {
        return {pub->data, pub->lastPublishTime};
    }
    return {SmallBuffer{}, Time::minVal()};
}